

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O0

void deductible_under_min(LossRec *x,OASIS_FLOAT min_ded,OASIS_FLOAT ded)

{
  float fVar1;
  OASIS_FLOAT local_20;
  OASIS_FLOAT loss_not_over_limit;
  OASIS_FLOAT loss;
  OASIS_FLOAT loss_delta;
  OASIS_FLOAT ded_local;
  OASIS_FLOAT min_ded_local;
  LossRec *x_local;
  
  fVar1 = (min_ded - ded) - x->effective_deductible;
  if (x->over_limit < fVar1) {
    fVar1 = fVar1 - x->over_limit;
    if (x->loss <= fVar1 + ded) {
      local_20 = 0.0;
      x->effective_deductible = x->effective_deductible + x->loss + x->over_limit;
      x->under_limit = x->under_limit + x->loss;
      x->over_limit = 0.0;
    }
    else {
      local_20 = (x->loss - fVar1) - ded;
      x->over_limit = 0.0;
      x->effective_deductible = min_ded;
      x->under_limit = x->under_limit + fVar1;
    }
  }
  else if (x->loss <= ded) {
    if ((x->over_limit - fVar1) + x->loss <= ded) {
      x->effective_deductible = x->effective_deductible + x->loss + x->over_limit;
      x->over_limit = 0.0;
      x->under_limit = x->under_limit + x->loss;
    }
    else {
      x->over_limit = (x->over_limit - fVar1) + ded;
      x->effective_deductible = min_ded;
      x->under_limit = x->under_limit + x->loss;
    }
    local_20 = 0.0;
  }
  else {
    local_20 = x->loss;
    x->over_limit = x->over_limit - fVar1;
    x->effective_deductible = min_ded;
  }
  x->loss = local_20;
  return;
}

Assistant:

void deductible_under_min(LossRec& x, OASIS_FLOAT min_ded, OASIS_FLOAT ded)
{ //If effective deductible + current deductible is less than the minimum, deductible will be increased to the minimum
	OASIS_FLOAT loss_delta =0;
	OASIS_FLOAT loss =0;
	OASIS_FLOAT loss_not_over_limit = 0;
	loss_delta = min_ded - ded - x.effective_deductible ; // loss to increase by the loss_delta	
	if (loss_delta <= x.over_limit) {
		if (x.loss > ded) {
			loss = x.loss;
			x.over_limit = x.over_limit - loss_delta;
			x.effective_deductible = min_ded;
		}
		else if (x.over_limit - loss_delta + x.loss > ded) {
			loss = 0;
			x.over_limit = x.over_limit - loss_delta + ded;
			x.effective_deductible = min_ded;
			x.under_limit = x.under_limit + x.loss;
		}
		else {
			x.effective_deductible = x.effective_deductible + x.loss + x.over_limit;
			loss = 0;
			x.over_limit = 0;
			x.under_limit = x.under_limit + x.loss;
		}
	}
	else {
		loss_not_over_limit = loss_delta - x.over_limit;
		if (x.loss > (loss_not_over_limit + ded)) {
			loss = x.loss - loss_not_over_limit - ded;
			x.over_limit = 0;
			x.effective_deductible = min_ded;
			x.under_limit = x.under_limit + loss_not_over_limit;
		}
		else {
			loss = 0;
			x.effective_deductible = x.effective_deductible + x.loss + x.over_limit;
			x.under_limit = x.under_limit + x.loss;
			x.over_limit = 0;
		}
	}
	x.loss = loss;
}